

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.h
# Opt level: O0

void __thiscall Js::ArgumentReader::AdjustArguments(ArgumentReader *this,CallInfo *callInfo)

{
  Type TVar1;
  CallInfo CVar2;
  code *pcVar3;
  bool bVar4;
  CallFlags CVar5;
  undefined4 *puVar6;
  CallInfo *callInfo_local;
  ArgumentReader *this_local;
  
  bVar4 = Arguments::HasNewTarget(&this->super_Arguments);
  if ((bVar4) &&
     (CVar5 = Js::operator&(SUB84((this->super_Arguments).Info,3) &
                            (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                             CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                            CallFlags_New),CallFlags_ExtraArg), CVar5 == CallFlags_None)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/Arguments.h"
                                ,0x121,
                                "(!this->HasNewTarget() || (Info.Flags & Js::CallFlags_ExtraArg))",
                                "NewTarget flag must be used together with ExtraArg.");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  CVar5 = Js::operator&(SUB84((this->super_Arguments).Info,3) &
                        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                         CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                        CallFlags_New),CallFlags_ExtraArg);
  if (CVar5 != CallFlags_None) {
    if (((ulong)(this->super_Arguments).Info & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/Arguments.h"
                                  ,0x126,"(Info.Count > 0)","Info.Count > 0");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    TVar1 = (this->super_Arguments).Info;
    CVar5 = operator~(CallFlags_ExtraArg);
    CVar5 = Js::operator&(TVar1._3_4_ &
                          (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                           CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                          CallFlags_New),CVar5);
    (this->super_Arguments).Info =
         (Type)((ulong)(this->super_Arguments).Info & 0xffffffff00ffffff |
               ((ulong)CVar5 & 0xff) << 0x18);
    CVar2 = *callInfo;
    CVar5 = operator~(CallFlags_ExtraArg);
    CVar5 = Js::operator&(CVar2._3_4_ &
                          (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                           CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                          CallFlags_New),CVar5);
    *callInfo = (CallInfo)((ulong)*callInfo & 0xffffffff00ffffff | ((ulong)CVar5 & 0xff) << 0x18);
  }
  return;
}

Assistant:

void AdjustArguments(CallInfo *callInfo)
        {
            AssertMsg(!this->HasNewTarget() || (Info.Flags & Js::CallFlags_ExtraArg), "NewTarget flag must be used together with ExtraArg.");
            if (Info.Flags & Js::CallFlags_ExtraArg)
            {
                // If "calling eval" is set, then the last param is the frame display, which only
                // the eval built-in should see.
                Assert(Info.Count > 0);
                // The local version should be consistent. On the other hand, lots of code throughout
                // jscript uses the callInfo from stack to get argument list etc. We'll need
                // to change all the caller to be aware of the id or somehow make sure they don't use
                // the stack version. Both seem risky. It would be safer and more robust to just
                // change the stack version.
                Info.Flags = (CallFlags)(Info.Flags & ~Js::CallFlags_ExtraArg);
                callInfo->Flags = (CallFlags)(callInfo->Flags & ~Js::CallFlags_ExtraArg);
            }
        }